

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

StructNew * __thiscall
wasm::Builder::makeStructNew(Builder *this,HeapType type,ExpressionList *args)

{
  uintptr_t in_RAX;
  StructNew *this_00;
  Type local_28;
  
  local_28.id = in_RAX;
  this_00 = MixedArena::alloc<wasm::StructNew>(&this->wasm->allocator);
  ArenaVector<wasm::Expression_*>::operator=(&this_00->operands,args);
  wasm::Type::Type(&local_28,type,NonNullable,Inexact);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       local_28.id;
  StructNew::finalize(this_00);
  return this_00;
}

Assistant:

StructNew* makeStructNew(HeapType type, ExpressionList&& args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands = std::move(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }